

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O3

Aggregate * __thiscall
hta::Metric::aggregate(Aggregate *__return_storage_ptr__,Metric *this,TimePoint begin,TimePoint end)

{
  long lVar1;
  Aggregate other;
  Aggregate other_00;
  Aggregate other_01;
  Aggregate other_02;
  Aggregate other_03;
  undefined4 extraout_var;
  long lVar2;
  duration extraout_RDX;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> begin_00;
  duration begin_01;
  duration dVar3;
  long lVar4;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> end_00;
  Duration interval;
  Aggregate local_120;
  Aggregate local_f0;
  Aggregate local_c0;
  Aggregate local_90;
  Aggregate local_60;
  
  check_read(this);
  if ((long)end.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r <=
      (long)begin.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r) {
    throw_exception<hta::Exception,char_const*,hta::Clock::time_point,char_const*,hta::Clock::time_point>
              ("invalid request: begin timestamp ",
               (time_point)
               begin.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r," larger than end timestamp ",
               (time_point)
               end.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r);
  }
  check_read(this);
  dVar3.__r._0_4_ =
       (*((this->storage_metric_)._M_t.
          super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>.
          _M_t.
          super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>
          .super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl)->_vptr_Metric[0xc])();
  dVar3.__r._4_4_ = extraout_var;
  if (extraout_RDX.__r <
      (long)begin.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r ||
      (long)end.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r <= dVar3.__r) {
    __return_storage_ptr__->minimum = INFINITY;
    __return_storage_ptr__->maximum = -INFINITY;
    __return_storage_ptr__->sum = 0.0;
    __return_storage_ptr__->count = 0;
    __return_storage_ptr__->integral = 0.0;
    (__return_storage_ptr__->active_time).__r = 0;
  }
  else {
    if ((long)begin.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r < dVar3.__r) {
      begin.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      .__d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                 )(time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   )dVar3.__r;
    }
    if (extraout_RDX.__r <
        (long)end.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) {
      end.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
      __d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
                (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
                extraout_RDX.__r;
    }
    interval.__r = (this->interval_min_).__r;
    lVar4 = interval.__r +
            (long)begin.
                  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  .__d.__r + -1;
    if ((lVar4 < 0) ||
       ((long)end.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r < 0)) {
LAB_0016a27e:
      __assert_fail("time.time_since_epoch().count() >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/include/hta/types.hpp"
                    ,0x92,"TimePoint hta::interval_begin(TimePoint, Duration)");
    }
    end_00.__d.__r = (duration)(lVar4 - lVar4 % interval.__r);
    begin_00.__d.__r =
         (duration)
         ((long)end.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r -
         (long)end.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r % interval.__r);
    if ((long)end_00.__d.__r < (long)begin_00.__d.__r) {
      __return_storage_ptr__->minimum = INFINITY;
      __return_storage_ptr__->maximum = -INFINITY;
      __return_storage_ptr__->sum = 0.0;
      __return_storage_ptr__->count = 0;
      __return_storage_ptr__->integral = 0.0;
      (__return_storage_ptr__->active_time).__r = 0;
      if ((long)end_00.__d.__r <
          (long)begin.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r) {
        __assert_fail("begin <= next_begin",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                      ,0xc3,"Aggregate hta::Metric::aggregate(hta::TimePoint, hta::TimePoint)");
      }
      aggregate_raw(&local_60,this,begin,(TimePoint)end_00.__d.__r);
      other.maximum = local_60.maximum;
      other.minimum = local_60.minimum;
      other.sum = local_60.sum;
      other.count = local_60.count;
      other.integral = local_60.integral;
      other.active_time.__r = local_60.active_time.__r;
      Aggregate::operator+=(__return_storage_ptr__,other);
      aggregate_raw(&local_90,this,(TimePoint)begin_00.__d.__r,end);
      other_00.maximum = local_90.maximum;
      other_00.minimum = local_90.minimum;
      other_00.sum = local_90.sum;
      other_00.count = local_90.count;
      other_00.integral = local_90.integral;
      other_00.active_time.__r = local_90.active_time.__r;
      Aggregate::operator+=(__return_storage_ptr__,other_00);
      lVar4 = (this->interval_factor_).factor_;
      lVar2 = lVar4 * interval.__r;
      if (SEXT816(lVar2) == SEXT816(lVar4) * SEXT816(interval.__r)) {
        do {
          lVar4 = lVar2;
          lVar2 = (long)end_00.__d.__r + lVar4 + -1;
          if (lVar2 < 0) goto LAB_0016a27e;
          dVar3.__r = lVar2 - lVar2 % lVar4;
          if (dVar3.__r < (long)end_00.__d.__r) {
            __assert_fail("begin <= next_begin",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                          ,0xcf,"Aggregate hta::Metric::aggregate(hta::TimePoint, hta::TimePoint)");
          }
          if ((long)begin_00.__d.__r < 0) goto LAB_0016a27e;
          if (((this->interval_max_).__r < lVar4) ||
             (begin_01 = begin_00.__d.__r - (long)begin_00.__d.__r % lVar4,
             begin_01.__r <= dVar3.__r)) {
            aggregate_interval(&local_c0,this,(TimePoint)end_00.__d.__r,(TimePoint)begin_00.__d.__r,
                               interval);
            other_03.maximum = local_c0.maximum;
            other_03.minimum = local_c0.minimum;
            other_03.sum = local_c0.sum;
            other_03.count = local_c0.count;
            other_03.integral = local_c0.integral;
            other_03.active_time.__r = local_c0.active_time.__r;
            Aggregate::operator+=(__return_storage_ptr__,other_03);
            if ((__return_storage_ptr__->active_time).__r ==
                (long)end.
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      .__d.__r -
                (long)begin.
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      .__d.__r) {
              return __return_storage_ptr__;
            }
            __assert_fail("a.active_time == expected_active_time",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                          ,0xe5,"Aggregate hta::Metric::aggregate(hta::TimePoint, hta::TimePoint)");
          }
          aggregate_interval(&local_f0,this,(TimePoint)end_00.__d.__r,(TimePoint)dVar3.__r,interval)
          ;
          other_01.maximum = local_f0.maximum;
          other_01.minimum = local_f0.minimum;
          other_01.sum = local_f0.sum;
          other_01.count = local_f0.count;
          other_01.integral = local_f0.integral;
          other_01.active_time.__r = local_f0.active_time.__r;
          Aggregate::operator+=(__return_storage_ptr__,other_01);
          aggregate_interval(&local_120,this,(TimePoint)begin_01.__r,(TimePoint)begin_00.__d.__r,
                             interval);
          other_02.maximum = local_120.maximum;
          other_02.minimum = local_120.minimum;
          other_02.sum = local_120.sum;
          other_02.count = local_120.count;
          other_02.integral = local_120.integral;
          other_02.active_time.__r = local_120.active_time.__r;
          Aggregate::operator+=(__return_storage_ptr__,other_02);
          lVar1 = (this->interval_factor_).factor_;
          lVar2 = lVar1 * lVar4;
          begin_00.__d.__r = (duration)(duration)begin_01.__r;
          end_00.__d.__r = (duration)(duration)dVar3.__r;
          interval.__r = lVar4;
        } while (SEXT816(lVar2) == SEXT816(lVar1) * SEXT816(lVar4));
      }
      throw_exception<hta::Exception,char_const*>("integer overflow during interval multiplication")
      ;
    }
    aggregate_raw(__return_storage_ptr__,this,begin,end);
  }
  return __return_storage_ptr__;
}

Assistant:

Aggregate Metric::aggregate(hta::TimePoint begin, hta::TimePoint end)
{
    check_read();
    if (begin >= end)
    {
        throw_exception("invalid request: begin timestamp ", begin, " larger than end timestamp ",
                        end);
    }
    // We must cap the end or we use intervals that are not yet completely written
    auto r = range();

    if (end <= r.first || begin > r.second)
    {
        // Really, nothing to see here if the first point isn't even in the interval
        return {};
    }

    // TODO We could further optimize requests from (before) the beginning of time by using the
    // incomplete intervals of upper levels rather than piecing together raw/low ones
    begin = std::clamp(begin, r.first, r.second);
    // We never consider anything after the last point in the data
    end = std::clamp(end, r.first, r.second);
    [[maybe_unused]] const auto expected_active_time = end - begin;

    auto interval = interval_min_;
    auto next_begin = interval_end(begin - Duration(1), interval);
    auto next_end = interval_begin(end, interval);

    if (next_begin >= next_end)
    {
        // No need to go to any intervals or do any splits, just one raw chunk
        return aggregate_raw(begin, end);
    }

    Aggregate a;
    assert(begin <= next_begin);
    a += aggregate_raw(begin, next_begin);
    begin = next_begin;

    assert(next_end <= end);
    a += aggregate_raw(next_end, end);
    end = next_end;

    while (true)
    {
        auto next_interval = interval * interval_factor_;
        next_begin = interval_end(begin - Duration(1), next_interval);
        assert(begin <= next_begin);
        next_end = interval_begin(end, next_interval);
        assert(next_end <= end);

        if (next_interval > interval_max_ || next_begin >= next_end)
        {
            // Finally use the contiguous block
            a += aggregate_interval(begin, end, interval);
            break;
        }

        // add left aggregates
        a += aggregate_interval(begin, next_begin, interval);
        begin = next_begin;

        // add right aggregates
        a += aggregate_interval(next_end, end, interval);
        end = next_end;

        interval = next_interval;
    }

    assert(a.active_time == expected_active_time);
    return a;
}